

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_throw_statement
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<xscript::tokenizer::token_t> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  bool bVar1;
  pointer this_00;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> *local_128;
  undefined8 local_120;
  allocator<char> local_111;
  string local_110;
  allocator<xscript::tokenizer::token_t> local_ee;
  less<xscript::tokenizer::token_t> local_ed;
  anon_enum_32 local_ec;
  iterator local_e8;
  size_type local_e0;
  set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
  local_d8;
  allocator<char> local_a1;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  undefined8 local_68;
  allocator<char> local_49;
  string local_48;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *local_28;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *node;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  node = parent;
  parent_local = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                  *)this;
  this_00 = std::
            unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
            operator->(parent);
  local_28 = ast_node::add_child(this_00,THROW_STATEMENT);
  bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_THROW);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_49);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"\'throw\' expected");
    local_68 = 1;
    args_00._M_len = 1;
    args_00._M_array = &local_80;
    local_70 = &local_80;
    this_local._7_1_ = process_failover(this,&local_48,0x37d,args_00,true);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    next(this);
    bVar1 = parse_expression(this,local_28);
    if (bVar1) {
      bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_SEMICOLON);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                   &local_111);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_138,"\';\' expected after throw statement");
        local_120 = 1;
        args._M_len = 1;
        args._M_array = &local_138;
        local_128 = &local_138;
        this_local._7_1_ = append_syntax_error(this,&local_110,0x386,args);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
      }
      else {
        next(this);
        this_local._7_1_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_a1);
      local_ec = TK_SEMICOLON;
      local_e8 = &local_ec;
      local_e0 = 1;
      std::allocator<xscript::tokenizer::token_t>::allocator(&local_ee);
      __l._M_len = local_e0;
      __l._M_array = local_e8;
      std::
      set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::set(&local_d8,__l,&local_ed,&local_ee);
      this_local._7_1_ = process_failover(this,&local_a0,0x382,&local_d8,true);
      std::
      set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::~set(&local_d8);
      std::allocator<xscript::tokenizer::token_t>::~allocator(&local_ee);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ast::parse_throw_statement(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(THROW_STATEMENT);

    if (cur_token != tokenizer::TK_THROW) {
        return failover({"'throw' expected"});
    }
    next();

    if (!parse_expression(node)) {
        return failover({tokenizer::TK_SEMICOLON});
    }

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"';' expected after throw statement"});
    }
    next();

    return true;
}